

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

int32_t __thiscall icu_63::RuleBasedBreakIterator::first(RuleBasedBreakIterator *this)

{
  UBool UVar1;
  UErrorCode status;
  UErrorCode local_c;
  
  local_c = U_ZERO_ERROR;
  UVar1 = BreakCache::seek(this->fBreakCache,0);
  if (UVar1 == '\0') {
    BreakCache::populateNear(this->fBreakCache,0,&local_c);
  }
  BreakCache::current(this->fBreakCache);
  return 0;
}

Assistant:

int32_t RuleBasedBreakIterator::first(void) {
    UErrorCode status = U_ZERO_ERROR;
    if (!fBreakCache->seek(0)) {
        fBreakCache->populateNear(0, status);
    }
    fBreakCache->current();
    U_ASSERT(fPosition == 0);
    return 0;
}